

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O1

uint __kmp_wait<unsigned_int>(uint *spinner,uint checker,_func_kmp_uint32_uint_uint *pred,void *obj)

{
  kmp_uint32 kVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  kmp_uint32 kVar5;
  int iVar6;
  
  kVar5 = __kmp_yield_init;
  puVar3 = (uint *)__kmp_itt_fsync_prepare_ptr__3_0;
  if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
    puVar3 = spinner;
  }
  kVar1 = (*pred)(*spinner,checker);
  iVar6 = 0;
  if (kVar1 == 0) {
    iVar6 = 0;
    do {
      if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
        if (iVar6 < __kmp_itt_prepare_delay) {
          iVar6 = iVar6 + 1;
          if (__kmp_itt_prepare_delay <= iVar6) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar3);
          }
        }
      }
      if (__kmp_use_yield - 1U < 2) {
        iVar4 = __kmp_avail_proc;
        if (__kmp_avail_proc == 0) {
          iVar4 = __kmp_xproc;
        }
        if (__kmp_nth <= iVar4) goto LAB_0015781d;
        __kmp_yield();
      }
      else {
LAB_0015781d:
        if (__kmp_use_yield == 1) {
          kVar5 = kVar5 - 2;
          if (kVar5 == 0) {
            __kmp_yield();
            kVar5 = __kmp_yield_next;
          }
        }
      }
      kVar1 = (*pred)(*spinner,checker);
    } while (kVar1 == 0);
  }
  if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6) {
    uVar2 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar3);
    return uVar2;
  }
  return (uint)__kmp_itt_fsync_acquired_ptr__3_0;
}

Assistant:

static UT __kmp_wait(volatile UT *spinner, UT checker,
                     kmp_uint32 (*pred)(UT, UT) USE_ITT_BUILD_ARG(void *obj)) {
  // note: we may not belong to a team at this point
  volatile UT *spin = spinner;
  UT check = checker;
  kmp_uint32 spins;
  kmp_uint32 (*f)(UT, UT) = pred;
  UT r;

  KMP_FSYNC_SPIN_INIT(obj, CCAST(UT *, spin));
  KMP_INIT_YIELD(spins);
  // main wait spin loop
  while (!f(r = *spin, check)) {
    KMP_FSYNC_SPIN_PREPARE(obj);
    /* GEH - remove this since it was accidentally introduced when kmp_wait was
       split.
       It causes problems with infinite recursion because of exit lock */
    /* if ( TCR_4(__kmp_global.g.g_done) && __kmp_global.g.g_abort)
        __kmp_abort_thread(); */
    // If oversubscribed, or have waited a bit then yield.
    KMP_YIELD_OVERSUB_ELSE_SPIN(spins);
  }
  KMP_FSYNC_SPIN_ACQUIRED(obj);
  return r;
}